

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O3

void __thiscall
Utils::ArgumentParser::ArgumentParser(ArgumentParser *this,string *_short,string *_long)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  p_Var1 = &(this->used_name)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->used_name)._M_t._M_impl = 0;
  *(undefined8 *)&(this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->used_identifier)._M_t._M_impl.super__Rb_tree_header;
  (this->used_name)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->used_identifier)._M_t._M_impl = 0;
  *(undefined8 *)&(this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->option_mapping)._M_t._M_impl.super__Rb_tree_header;
  (this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positionals).
  super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->option_mapping)._M_t._M_impl = 0;
  *(undefined8 *)&(this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->flag_mapping)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->flag_mapping)._M_t._M_impl = 0;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->program_name)._M_dataplus._M_p = (pointer)&(this->program_name).field_2;
  (this->program_name)._M_string_length = 0;
  (this->program_name).field_2._M_local_buf[0] = '\0';
  (this->short_text)._M_dataplus._M_p = (pointer)&(this->short_text).field_2;
  pcVar2 = (_short->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->short_text,pcVar2,pcVar2 + _short->_M_string_length);
  (this->long_text)._M_dataplus._M_p = (pointer)&(this->long_text).field_2;
  pcVar2 = (_long->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->long_text,pcVar2,pcVar2 + _long->_M_string_length);
  return;
}

Assistant:

ArgumentParser( const std::string& _short, const std::string& _long) :
        used_name(),
        used_identifier(),
        positionals(),
        options(),
        flags(),
        option_mapping(),
        flag_mapping(),
        program_name(),
        short_text(_short),
        long_text(_long)
    {}